

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNamesImpl::getDisplayNames
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UTimeZoneNameType *types,int32_t numTypes,
          UDate date,UnicodeString *dest,UErrorCode *status)

{
  UTimeZoneNameType type_00;
  bool bVar1;
  UBool UVar2;
  ZNames *this_00;
  ConstChar16Ptr local_d0;
  Mutex local_c8;
  Mutex lock_1;
  UnicodeString mzID;
  UChar *name;
  UTimeZoneNameType type;
  int i;
  Mutex local_60;
  Mutex lock;
  TimeZoneNamesImpl *nonConstThis;
  void *mznames;
  void *tznames;
  UErrorCode *status_local;
  UnicodeString *dest_local;
  UDate date_local;
  int32_t numTypes_local;
  UTimeZoneNameType *types_local;
  UnicodeString *tzID_local;
  TimeZoneNamesImpl *this_local;
  
  UVar2 = ::U_FAILURE(*status);
  if ((UVar2 == '\0') && (UVar2 = UnicodeString::isEmpty(tzID), UVar2 == '\0')) {
    nonConstThis = (TimeZoneNamesImpl *)0x0;
    lock.fMutex = (UMutex *)this;
    Mutex::Mutex(&local_60,(UMutex *)gDataMutex);
    this_00 = loadTimeZoneNames((TimeZoneNamesImpl *)lock.fMutex,tzID,status);
    UVar2 = ::U_FAILURE(*status);
    Mutex::~Mutex(&local_60);
    if (UVar2 == '\0') {
      for (name._4_4_ = 0; name._4_4_ < numTypes; name._4_4_ = name._4_4_ + 1) {
        type_00 = types[name._4_4_];
        mzID.fUnion._48_8_ = ZNames::getName(this_00,type_00);
        if ((UChar *)mzID.fUnion._48_8_ == (UChar *)0x0) {
          if (nonConstThis == (TimeZoneNamesImpl *)0x0) {
            UnicodeString::UnicodeString((UnicodeString *)&lock_1);
            (*(this->super_TimeZoneNames).super_UObject._vptr_UObject[7])
                      (date,this,tzID,(UnicodeString *)&lock_1);
            UVar2 = UnicodeString::isEmpty((UnicodeString *)&lock_1);
            if (UVar2 == '\0') {
              Mutex::Mutex(&local_c8,(UMutex *)gDataMutex);
              nonConstThis = (TimeZoneNamesImpl *)
                             loadMetaZoneNames((TimeZoneNamesImpl *)lock.fMutex,
                                               (UnicodeString *)&lock_1,status);
              UVar2 = ::U_FAILURE(*status);
              if (UVar2 == '\0') {
                if (nonConstThis == (TimeZoneNamesImpl *)0x0) {
                  nonConstThis = (TimeZoneNamesImpl *)EMPTY;
                }
                bVar1 = false;
              }
              else {
                bVar1 = true;
              }
              Mutex::~Mutex(&local_c8);
              if (!bVar1) goto LAB_0024705e;
            }
            else {
              nonConstThis = (TimeZoneNamesImpl *)EMPTY;
LAB_0024705e:
              bVar1 = false;
            }
            UnicodeString::~UnicodeString((UnicodeString *)&lock_1);
            if (bVar1) {
              return;
            }
          }
          if (nonConstThis != (TimeZoneNamesImpl *)"<empty>") {
            mzID.fUnion._48_8_ = ZNames::getName((ZNames *)nonConstThis,type_00);
          }
        }
        if (mzID.fUnion._48_8_ == 0) {
          UnicodeString::setToBogus(dest + name._4_4_);
        }
        else {
          ConstChar16Ptr::ConstChar16Ptr(&local_d0,(char16_t *)mzID.fUnion._48_8_);
          UnicodeString::setTo(dest + name._4_4_,'\x01',&local_d0,-1);
          ConstChar16Ptr::~ConstChar16Ptr(&local_d0);
        }
      }
    }
  }
  return;
}

Assistant:

void TimeZoneNamesImpl::getDisplayNames(const UnicodeString& tzID,
        const UTimeZoneNameType types[], int32_t numTypes,
        UDate date, UnicodeString dest[], UErrorCode& status) const {
    if (U_FAILURE(status)) return;

    if (tzID.isEmpty()) { return; }
    void* tznames = NULL;
    void* mznames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl*>(this);

    // Load the time zone strings
    {
        Mutex lock(&gDataMutex);
        tznames = (void*) nonConstThis->loadTimeZoneNames(tzID, status);
        if (U_FAILURE(status)) { return; }
    }
    U_ASSERT(tznames != NULL);

    // Load the values into the dest array
    for (int i = 0; i < numTypes; i++) {
        UTimeZoneNameType type = types[i];
        const UChar* name = ((ZNames*)tznames)->getName(type);
        if (name == NULL) {
            if (mznames == NULL) {
                // Load the meta zone name
                UnicodeString mzID;
                getMetaZoneID(tzID, date, mzID);
                if (mzID.isEmpty()) {
                    mznames = (void*) EMPTY;
                } else {
                    // Load the meta zone strings
                    // Mutex is scoped to the "else" statement
                    Mutex lock(&gDataMutex);
                    mznames = (void*) nonConstThis->loadMetaZoneNames(mzID, status);
                    if (U_FAILURE(status)) { return; }
                    // Note: when the metazone doesn't exist, in Java, loadMetaZoneNames returns
                    // a dummy object instead of NULL.
                    if (mznames == NULL) {
                        mznames = (void*) EMPTY;
                    }
                }
            }
            U_ASSERT(mznames != NULL);
            if (mznames != EMPTY) {
                name = ((ZNames*)mznames)->getName(type);
            }
        }
        if (name != NULL) {
            dest[i].setTo(TRUE, name, -1);
        } else {
            dest[i].setToBogus();
        }
    }
}